

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O0

void helics::CommFactory::defineCommBuilder
               (shared_ptr<helics::CommFactory::CommBuilder> *builder,string_view name,int code)

{
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  shared_ptr<helics::CommFactory::CommBuilder> *this;
  string_view in_stack_ffffffffffffffa8;
  shared_ptr<helics::CommFactory::CommBuilder> local_30 [3];
  
  this = local_30;
  std::shared_ptr<helics::CommFactory::CommBuilder>::shared_ptr
            (this,(shared_ptr<helics::CommFactory::CommBuilder> *)
                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  MasterCommBuilder::addBuilder(this,in_stack_ffffffffffffffa8,in_stack_ffffffffffffff9c);
  std::shared_ptr<helics::CommFactory::CommBuilder>::~shared_ptr
            ((shared_ptr<helics::CommFactory::CommBuilder> *)0x4cb11a);
  return;
}

Assistant:

void defineCommBuilder(std::shared_ptr<CommBuilder> builder, std::string_view name, int code)
    {
        MasterCommBuilder::addBuilder(std::move(builder), name, code);
    }